

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall
ac::core::Image::create(Image *this,int w,int h,int c,ElementType elementType,int stride)

{
  element_type *peVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  shared_ptr<ac::core::Image::ImageData> *in_RDI;
  uint in_R8D;
  int in_R9D;
  int size;
  int pitch;
  undefined4 in_stack_ffffffffffffffb8;
  
  if (in_R9D < 1) {
    in_R9D = in_ESI * in_ECX * (in_R8D & 0xff);
  }
  if (0 < in_EDX * in_R9D) {
    *(int *)&(in_RDI->super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr = in_ESI;
    *(int *)((long)&(in_RDI->
                    super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr + 4) = in_EDX;
    *(int *)&(in_RDI->super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi = in_ECX;
    *(uint *)((long)&(in_RDI->
                     super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi + 4) = in_R8D;
    *(int *)&in_RDI[1].super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr = in_R9D;
    std::make_shared<ac::core::Image::ImageData,int&>((int *)CONCAT44(in_ECX,in_R8D));
    std::shared_ptr<ac::core::Image::ImageData>::operator=
              (in_RDI,(shared_ptr<ac::core::Image::ImageData> *)
                      CONCAT44(in_R9D,in_stack_ffffffffffffffb8));
    std::shared_ptr<ac::core::Image::ImageData>::~shared_ptr
              ((shared_ptr<ac::core::Image::ImageData> *)0x178325);
    peVar1 = std::
             __shared_ptr_access<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x178333);
    in_RDI[1].super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1->data;
  }
  return;
}

Assistant:

void ac::core::Image::create(const int w, const int h, const int c, const ElementType elementType, const int stride)
{
    int pitch = stride > 0 ? stride : w * c * (elementType & 0xff);
    int size = h * pitch;
    if (!(size > 0)) return;
    this->w = w;
    this->h = h;
    this->c = c;
    this->elementType = elementType;
    this->pitch = pitch;
    this->dptr = std::make_shared<ImageData>(size);
    this->pixels = this->dptr->data;
}